

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::generate_deserialize_container
          (t_netstd_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int *piVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string i;
  string obj;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 != '\0') {
      paVar5 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_set","");
      t_generator::tmp(&local_190,(t_generator *)this,&local_70);
      std::__cxx11::string::operator=((string *)&local_150,(string *)&local_190);
      _Var6._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
        _Var6._M_p = local_70._M_dataplus._M_p;
      }
      goto LAB_002d2df6;
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar3 != '\0') {
      paVar5 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"_list","");
      t_generator::tmp(&local_190,(t_generator *)this,&local_90);
      std::__cxx11::string::operator=((string *)&local_150,(string *)&local_190);
      _Var6._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
        _Var6._M_p = local_90._M_dataplus._M_p;
      }
      goto LAB_002d2df6;
    }
  }
  else {
    paVar5 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_map","");
    t_generator::tmp(&local_190,(t_generator *)this,&local_50);
    std::__cxx11::string::operator=((string *)&local_150,(string *)&local_190);
    _Var6._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
      _Var6._M_p = local_50._M_dataplus._M_p;
    }
LAB_002d2df6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar5) {
      operator_delete(_Var6._M_p);
    }
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 != '\0') {
      t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_190._M_dataplus._M_p,local_190._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"TSet ",5);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_150._M_dataplus._M_p,local_150._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," = await iprot.ReadSetBeginAsync(",0x21);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                          CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002d3026;
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar3 != '\0') {
      t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_190._M_dataplus._M_p,local_190._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"TList ",6);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_150._M_dataplus._M_p,local_150._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," = await iprot.ReadListBeginAsync(",0x22);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                          CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002d3026;
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_190._M_dataplus._M_p,local_190._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"TMap ",5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_150._M_dataplus._M_p,local_150._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," = await iprot.ReadMapBeginAsync(",0x21);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                        CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_002d3026:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
  }
  t_generator::indent_abi_cxx11_(&local_190,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_190._M_dataplus._M_p,local_190._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = new ",7);
  type_name_abi_cxx11_(&local_170,this,ttype,true);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".Count);",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar5 = &local_170.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar5) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"_i","");
  t_generator::tmp(&local_190,(t_generator *)this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"for(int ",8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_190._M_dataplus._M_p,local_190._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = 0; ",6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_190._M_dataplus._M_p,local_190._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," < ",3);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".Count; ++",10);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_190._M_dataplus._M_p,local_190._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar5) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 != '\0') {
      paVar7 = &local_110.field_2;
      pcVar2 = (prefix->_M_dataplus)._M_p;
      local_110._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar2,pcVar2 + prefix->_M_string_length);
      generate_deserialize_set_element(this,out,(t_set *)ttype,&local_110);
      _Var6._M_p = local_110._M_dataplus._M_p;
      goto LAB_002d33d3;
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar3 != '\0') {
      paVar7 = &local_130.field_2;
      pcVar2 = (prefix->_M_dataplus)._M_p;
      local_130._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar2,pcVar2 + prefix->_M_string_length);
      generate_deserialize_list_element(this,out,(t_list *)ttype,&local_130);
      _Var6._M_p = local_130._M_dataplus._M_p;
      goto LAB_002d33d3;
    }
  }
  else {
    paVar7 = &local_f0.field_2;
    pcVar2 = (prefix->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + prefix->_M_string_length);
    generate_deserialize_map_element(this,out,(t_map *)ttype,&local_f0);
    _Var6._M_p = local_f0._M_dataplus._M_p;
LAB_002d33d3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar7) {
      operator_delete(_Var6._M_p);
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar5) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar3 == '\0') goto LAB_002d35f1;
      t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"await iprot.ReadListEndAsync(",0x1d);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                          CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"await iprot.ReadSetEndAsync(",0x1c)
      ;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                          CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"await iprot.ReadMapEndAsync(",0x1c);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                        CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar5) {
    operator_delete(local_170._M_dataplus._M_p);
  }
LAB_002d35f1:
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar5) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix)
{
    out << indent() << "{" << endl;
    indent_up();

    string obj;

    if (ttype->is_map())
    {
        obj = tmp("_map");
    }
    else if (ttype->is_set())
    {
        obj = tmp("_set");
    }
    else if (ttype->is_list())
    {
        obj = tmp("_list");
    }

    if (ttype->is_map())
    {
        out << indent() << "TMap " << obj << " = await iprot.ReadMapBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "TSet " << obj << " = await iprot.ReadSetBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "TList " << obj << " = await iprot.ReadListBeginAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    out << indent() << prefix << " = new " << type_name(ttype) << "(" << obj << ".Count);" << endl;
    string i = tmp("_i");
    out << indent() << "for(int " << i << " = 0; " << i << " < " << obj << ".Count; ++" << i << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    if (ttype->is_map())
    {
        generate_deserialize_map_element(out, static_cast<t_map*>(ttype), prefix);
    }
    else if (ttype->is_set())
    {
        generate_deserialize_set_element(out, static_cast<t_set*>(ttype), prefix);
    }
    else if (ttype->is_list())
    {
        generate_deserialize_list_element(out, static_cast<t_list*>(ttype), prefix);
    }

    indent_down();
    out << indent() << "}" << endl;

    if (ttype->is_map())
    {
        out << indent() << "await iprot.ReadMapEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "await iprot.ReadSetEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "await iprot.ReadListEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    indent_down();
    out << indent() << "}" << endl;
}